

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>
::
Insert<(JsUtil::SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>::InsertOperations)2>
          (SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>
           *this,TBKey *key,TBValue *value)

{
  SplitWeakDictionary<int,Js::PropertyString*,false,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock,Memory::Recycler>
  *pSVar1;
  hash_t hashCode;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 *puVar6;
  int *piVar7;
  long lVar8;
  uint local_3c;
  
  lVar8 = *(long *)(this + 8);
  if (lVar8 == 0) {
    SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
    ::Initialize((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  *)this,0);
    lVar8 = *(long *)(this + 8);
  }
  hashCode = *key * 2 + 1;
  local_3c = SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
             ::GetBucket((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                          *)this,hashCode);
  piVar7 = (int *)(lVar8 + (ulong)local_3c * 4);
  while( true ) {
    iVar4 = *piVar7;
    lVar8 = (long)iVar4;
    if (lVar8 < 0) break;
    if (*(int *)(*(long *)(this + 0x10) + lVar8 * 8) == *key) {
      SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
      ::SetValue<false>((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                         *)this,value,iVar4);
      return iVar4;
    }
    piVar7 = (int *)(*(long *)(this + 0x10) + lVar8 * 8 + 4);
  }
  iVar4 = *(int *)(this + 0x38);
  if (iVar4 == 0) {
    if (*(int *)(this + 0x30) == *(int *)(this + 0x28)) {
      (*(code *)**(undefined8 **)this)(this);
      iVar4 = *(int *)(this + 0x38);
      if (iVar4 != 0) goto LAB_006f9be5;
    }
    iVar5 = *(int *)(this + 0x28);
    iVar4 = *(int *)(this + 0x30);
    if (iVar4 == iVar5) {
      SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
      ::Resize((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                *)this);
      local_3c = SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                 ::GetBucket((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                              *)this,hashCode);
      iVar5 = *(int *)(this + 0x28);
      iVar4 = *(int *)(this + 0x30);
    }
    *(int *)(this + 0x30) = iVar4 + 1;
    if (iVar5 < iVar4 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x2ba,"(count <= size)","count <= size");
      if (!bVar3) goto LAB_006f9ebf;
      *puVar6 = 0;
      iVar5 = *(int *)(this + 0x28);
    }
    if (iVar5 <= iVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,699,"(index < size)","index < size");
      if (!bVar3) goto LAB_006f9ebf;
      *puVar6 = 0;
    }
  }
  else {
LAB_006f9be5:
    if (iVar4 < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x29d,"(freeCount > 0)","freeCount > 0");
      if (!bVar3) goto LAB_006f9ebf;
      *puVar6 = 0;
    }
    iVar4 = *(int *)(this + 0x34);
    if (iVar4 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x29e,"(freeList >= 0)","freeList >= 0");
      if (!bVar3) goto LAB_006f9ebf;
      *puVar6 = 0;
      iVar4 = *(int *)(this + 0x34);
    }
    if (*(int *)(this + 0x30) <= iVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x29f,"(freeList < count)","freeList < count");
      if (!bVar3) goto LAB_006f9ebf;
      *puVar6 = 0;
      iVar4 = *(int *)(this + 0x34);
    }
    pSVar1 = this + 0x38;
    *(int *)pSVar1 = *(int *)pSVar1 + -1;
    if (*(int *)pSVar1 != 0) {
      lVar8 = *(long *)(this + 0x10);
      iVar5 = *(int *)(lVar8 + 4 + (long)iVar4 * 8);
      if (-2 < iVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                           ,0x1a9,"(IsFreeEntry(freeEntry))","IsFreeEntry(freeEntry)");
        if (!bVar3) {
LAB_006f9ebf:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
        iVar5 = *(int *)(lVar8 + 4 + (long)iVar4 * 8);
      }
      *(int *)(this + 0x34) = -2 - iVar5;
    }
  }
  SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  ::SetKeyValue<false>
            ((SplitWeakDictionary<int,_Js::PropertyString_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              *)this,key,value,iVar4);
  lVar8 = *(long *)(this + 8);
  *(undefined4 *)(*(long *)(this + 0x10) + 4 + (long)iVar4 * 8) =
       *(undefined4 *)(lVar8 + (ulong)local_3c * 4);
  *(int *)(lVar8 + (ulong)local_3c * 4) = iVar4;
  return iVar4;
}

Assistant:

int Insert(const TBKey& key, const TBValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCodeWithKey<TBKey>(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket], last = -1; i >= 0;)
                {
                    TBKey k = this->GetKey(i);
                    if (this->RemoveIfCollected(k, &i, last, targetBucket))
                    {
                        continue;
                    }

                    if (Comparer<TBKey>::Equals(k, key))
                    {
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            SetValue(value, i);
                            return i;
                        }
                        return -1;
                    }

                    last = i;
                    i = localEntries[i].next;
                }
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (freeCount == 0 && count == size)
            {
                this->Cleanup();
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if (freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            SetKeyValue(key, value, index);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

            return index;
        }